

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

ElementList * __thiscall
lunasvg::Document::querySelectorAll
          (ElementList *__return_storage_ptr__,Document *this,string *content)

{
  anon_class_16_2_c48942ba callback;
  string_view input;
  bool bVar1;
  pointer this_00;
  undefined1 local_38 [8];
  SelectorList selectors;
  string *content_local;
  Document *this_local;
  ElementList *elements;
  
  selectors.
  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)content;
  input = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)content);
  parseQuerySelectors((SelectorList *)local_38,input);
  bVar1 = std::
          vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
          ::empty((vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   *)local_38);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<lunasvg::Element,_std::allocator<lunasvg::Element>_>::vector(__return_storage_ptr__)
    ;
  }
  else {
    std::vector<lunasvg::Element,_std::allocator<lunasvg::Element>_>::vector(__return_storage_ptr__)
    ;
    this_00 = std::
              unique_ptr<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>::
              operator->(&this->m_rootElement);
    callback.elements = __return_storage_ptr__;
    callback.selectors = (SelectorList *)local_38;
    SVGElement::
    transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
              ((SVGElement *)this_00,callback);
  }
  std::
  vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ::~vector((vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ElementList Document::querySelectorAll(const std::string& content) const
{
    auto selectors = parseQuerySelectors(content);
    if(selectors.empty())
        return ElementList();
    ElementList elements;
    m_rootElement->transverse([&](SVGElement* element) {
        for(const auto& selector : selectors) {
            if(matchSelector(selector, element)) {
                elements.push_back(element);
                break;
            }
        }
    });

    return elements;
}